

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragOpInteractionCase.cpp
# Opt level: O1

IterateResult __thiscall deqp::gls::FragOpInteractionCase::iterate(FragOpInteractionCase *this)

{
  size_type *psVar1;
  pointer puVar2;
  float fVar3;
  VertexComponentType VVar4;
  VertexComponentConversion VVar5;
  TestLog *pTVar6;
  Variable *pVVar7;
  ShaderInput *pSVar8;
  float *pfVar9;
  pointer pcVar10;
  long lVar11;
  uint *puVar12;
  ChannelType CVar13;
  uint uVar14;
  deBool dVar15;
  int iVar16;
  deUint32 dVar17;
  deUint32 dVar18;
  deUint32 dVar19;
  deBool dVar20;
  undefined4 uVar21;
  TextureFormat *pTVar22;
  undefined8 *puVar23;
  InternalError *pIVar24;
  pointer pVVar25;
  ulong *puVar26;
  pointer ppSVar27;
  pointer puVar28;
  float *pfVar29;
  undefined4 extraout_var;
  undefined8 *puVar30;
  undefined4 extraout_var_00;
  TestError *this_00;
  int iVar31;
  uint uVar32;
  int iVar33;
  long lVar34;
  TextureFormat TVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  int ndx;
  IterateResult IVar39;
  _Alloc_hider _Var40;
  int vtxNdx;
  int iVar41;
  ulong *puVar42;
  byte bVar43;
  void *pvVar44;
  ulong uVar45;
  ulong uVar46;
  pointer_____offset_0x10___ *ppuVar47;
  int iVar48;
  uint uVar49;
  int iVar50;
  uint uVar51;
  long lVar52;
  bool bVar53;
  float fVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  Vector<float,_3> res;
  VertexDataStorage vertexData;
  vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> uniformValues;
  Surface reference;
  Surface rendered;
  Vector<float,_3> result;
  Vec4 vtxInterpFactors [4];
  ScopedLogSection section;
  deUint32 programs [2];
  Random rnd;
  VertexArrayBinding layoutEntry;
  float *dst;
  TextureFormat local_368;
  ReferenceContext *pRStack_360;
  long local_350;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_348;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vStack_330;
  string local_318;
  Surface local_2f0;
  Surface local_2d0;
  long local_2b0;
  long local_2a8;
  ulong *local_2a0;
  long local_298;
  long local_290;
  undefined1 local_288 [8];
  TextureFormat TStack_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined8 uStack_268;
  PixelBufferAccess local_260;
  pointer local_238;
  pointer local_230;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  TextureFormat local_218;
  long lStack_210;
  pointer local_208;
  undefined1 *puStack_200;
  undefined8 local_1f8;
  undefined1 *puStack_1f0;
  undefined1 *local_1e8;
  undefined8 uStack_1e0;
  ScopedLogSection local_1d0;
  deUint32 local_1c8 [2];
  deRandom local_1c0;
  undefined1 local_1b0 [8];
  TextureFormat local_1a8;
  undefined1 local_1a0 [24];
  ChannelOrder local_188;
  VertexArrayPointer local_180 [2];
  ios_base local_140 [264];
  pointer local_38;
  
  uVar14 = ((uint)this->m_iterNdx >> 0x10 ^ this->m_iterNdx ^ 0x3d) * 9;
  uVar14 = (uVar14 >> 4 ^ uVar14) * 0x27d4eb2d;
  deRandom_init(&local_1c0,uVar14 >> 0xf ^ (this->m_params).seed ^ uVar14);
  pTVar6 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_218 = (TextureFormat)&local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Iter","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_iterNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  puVar28 = (pointer)0xf;
  if (local_218 != (TextureFormat)&local_208) {
    puVar28 = local_208;
  }
  if (puVar28 < local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish + lStack_210) {
    puVar28 = (pointer)0xf;
    if ((pointer *)
        local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      puVar28 = local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    }
    if (puVar28 < local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish + lStack_210) goto LAB_018af8a4;
    pTVar22 = (TextureFormat *)
              std::__cxx11::string::replace((ulong)&local_348,0,(char *)0x0,(ulong)local_218);
  }
  else {
LAB_018af8a4:
    pTVar22 = (TextureFormat *)
              std::__cxx11::string::_M_append
                        ((char *)&local_218,
                         (ulong)local_348.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
  }
  local_288 = (undefined1  [8])&local_278;
  TVar35 = (TextureFormat)(pTVar22 + 2);
  if (*pTVar22 == TVar35) {
    local_278._M_allocated_capacity._0_4_ = *(undefined4 *)TVar35;
    local_278._M_allocated_capacity._4_4_ = pTVar22[2].type;
    local_278._8_4_ = pTVar22[3].order;
    CVar13 = pTVar22[3].type;
    local_278._M_local_buf[0xc] = (char)CVar13;
    local_278._M_local_buf[0xd] = (char)(CVar13 >> 8);
    local_278._14_2_ = (undefined2)(CVar13 >> 0x10);
  }
  else {
    local_278._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)TVar35;
    local_278._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)TVar35 >> 0x20);
    local_288 = (undefined1  [8])*pTVar22;
  }
  TStack_280 = pTVar22[1];
  *pTVar22 = TVar35;
  pTVar22[1].order = R;
  pTVar22[1].type = SNORM_INT8;
  *(char *)TVar35 = '\0';
  puVar30 = &local_2d0.m_pixels.m_cap;
  local_2d0._0_8_ = puVar30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Iteration ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_iterNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  pvVar44 = (void *)0xf;
  if ((undefined8 *)local_2d0._0_8_ != puVar30) {
    pvVar44 = (void *)local_2d0.m_pixels.m_cap;
  }
  if (pvVar44 < (void *)((long)local_2f0.m_pixels.m_ptr + (long)local_2d0.m_pixels.m_ptr)) {
    pvVar44 = (void *)0xf;
    if ((size_t *)CONCAT44(local_2f0.m_height,local_2f0.m_width) != &local_2f0.m_pixels.m_cap) {
      pvVar44 = (void *)local_2f0.m_pixels.m_cap;
    }
    if ((void *)((long)local_2f0.m_pixels.m_ptr + (long)local_2d0.m_pixels.m_ptr) <= pvVar44) {
      puVar23 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,local_2d0._0_8_);
      goto LAB_018afa16;
    }
  }
  puVar23 = (undefined8 *)
            std::__cxx11::string::_M_append
                      ((char *)&local_2d0,CONCAT44(local_2f0.m_height,local_2f0.m_width));
LAB_018afa16:
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  psVar1 = puVar23 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar23 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_318.field_2._M_allocated_capacity = *psVar1;
    local_318.field_2._8_8_ = puVar23[3];
  }
  else {
    local_318.field_2._M_allocated_capacity = *psVar1;
    local_318._M_dataplus._M_p = (pointer)*puVar23;
  }
  local_318._M_string_length = puVar23[1];
  *puVar23 = psVar1;
  puVar23[1] = 0;
  *(undefined1 *)psVar1 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_1d0,pTVar6,(string *)local_288,&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((size_t *)CONCAT44(local_2f0.m_height,local_2f0.m_width) != &local_2f0.m_pixels.m_cap) {
    operator_delete((undefined1 *)CONCAT44(local_2f0.m_height,local_2f0.m_width),
                    local_2f0.m_pixels.m_cap + 1);
  }
  if ((undefined8 *)local_2d0._0_8_ != puVar30) {
    operator_delete((void *)local_2d0._0_8_,local_2d0.m_pixels.m_cap + 1);
  }
  if (local_288 != (undefined1  [8])&local_278) {
    operator_delete((void *)local_288,
                    CONCAT44(local_278._M_allocated_capacity._4_4_,
                             local_278._M_allocated_capacity._0_4_) + 1);
  }
  if ((pointer *)
      local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)(local_348.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  if (local_218 != (TextureFormat)&local_208) {
    operator_delete((void *)local_218,(ulong)(local_208 + 1));
  }
  ppSVar27 = (this->m_vertexShader).m_inputs.
             super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  iVar16 = (int)((ulong)((long)(this->m_vertexShader).m_inputs.
                               super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar27) >> 3);
  bVar53 = 0 < iVar16;
  if (0 < iVar16) {
    lVar37 = 9;
    lVar52 = 0;
    do {
      local_290 = lVar37;
      dVar15 = deStringEqual((ppSVar27[lVar52]->m_variable->m_name)._M_dataplus._M_p,"dEQP_Position"
                            );
      if (dVar15 != 0) {
        if (bVar53) {
          vStack_330.
          super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_330.
          super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vStack_330.
          super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ppSVar27 = (this->m_vertexShader).m_inputs.
                     super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          local_2a8 = lVar52;
          if (ppSVar27 ==
              (this->m_vertexShader).m_inputs.
              super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            iVar16 = 0;
            pVVar25 = vStack_330.
                      super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            iVar16 = 0;
            do {
              pVVar7 = (*ppSVar27)->m_variable;
              if (((pVVar7->m_type).m_baseType != TYPE_FLOAT) ||
                 (iVar31 = (pVVar7->m_type).m_numElements, 3 < iVar31 - 1U)) {
                pIVar24 = (InternalError *)__cxa_allocate_exception(0x38);
                tcu::InternalError::InternalError
                          (pIVar24,(char *)0x0,
                           "type.getBaseType() == rsg::VariableType::TYPE_FLOAT && de::inRange(type.getNumElements(), 1, 4)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragOpInteractionCase.cpp"
                           ,0x5c);
                __cxa_throw(pIVar24,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_218,(pVVar7->m_name)._M_dataplus._M_p,
                         (allocator<char> *)&local_318);
              local_288._0_4_ = A;
              TStack_280 = (TextureFormat)((long)local_278._M_local_buf + 8);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&TStack_280,local_218,lStack_210 + (long)local_218);
              local_260.super_ConstPixelBufferAccess.m_format.order = R;
              local_1b0._0_4_ = local_288._0_4_;
              local_1a8 = (TextureFormat)(local_1a0 + 8);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_1b0 + 8),TStack_280,
                         (char *)(CONCAT44(local_278._M_allocated_capacity._4_4_,
                                           local_278._M_allocated_capacity._0_4_) + (long)TStack_280
                                 ));
              local_180[0].data = (void *)(long)iVar16;
              local_188 = local_260.super_ConstPixelBufferAccess.m_format.order;
              local_180[0].componentType = VTX_COMP_FLOAT;
              local_180[0].convert = VTX_COMP_CONVERT_NONE;
              local_180[0].numElements = 4;
              local_180[0].stride = 0;
              local_180[0].numComponents = iVar31;
              if (TStack_280 != (TextureFormat)((long)local_278._M_local_buf + 8)) {
                operator_delete((void *)TStack_280,
                                CONCAT26(local_278._14_2_,
                                         CONCAT15(local_278._M_local_buf[0xd],
                                                  CONCAT14(local_278._M_local_buf[0xc],
                                                           local_278._8_4_))) + 1);
              }
              std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
              emplace_back<glu::VertexArrayBinding>(&vStack_330,(VertexArrayBinding *)local_1b0);
              if (local_1a8 != (TextureFormat)(local_1a0 + 8)) {
                operator_delete((void *)local_1a8,local_1a0._8_8_ + 1);
              }
              if (local_218 != (TextureFormat)&local_208) {
                operator_delete((void *)local_218,(ulong)(local_208 + 1));
              }
              iVar16 = iVar16 + iVar31 * 4;
              ppSVar27 = ppSVar27 + 1;
              pVVar25 = vStack_330.
                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (ppSVar27 !=
                     (this->m_vertexShader).m_inputs.
                     super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          }
          for (; pVVar25 !=
                 vStack_330.
                 super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                 ._M_impl.super__Vector_impl_data._M_finish; pVVar25 = pVVar25 + 1) {
            (pVVar25->pointer).stride = iVar16;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_348,(long)(iVar16 << 2));
          lVar37 = local_2a8;
          local_318._M_dataplus._M_p = (pointer)0x0;
          local_318._M_string_length = 0;
          local_318.field_2._M_allocated_capacity = 0;
          puVar26 = (ulong *)operator_new(800);
          local_2b0 = 0;
          lVar52 = 0;
          do {
            puVar30 = (undefined8 *)((long)puVar26 + lVar52 + 0x18);
            *puVar30 = 0;
            puVar30[1] = 0;
            *(undefined1 *)((long)puVar26 + lVar52 + 0x28) = 0;
            *(undefined4 *)((long)puVar26 + lVar52 + 0x68) = 0;
            *(undefined2 *)((long)puVar26 + lVar52 + 0x6c) = 0;
            puVar30 = (undefined8 *)((long)puVar26 + lVar52 + 0x70);
            *puVar30 = 0;
            puVar30[1] = 0;
            puVar30 = (undefined8 *)((long)puVar26 + lVar52 + 0x80);
            *puVar30 = 0;
            puVar30[1] = 0;
            puVar30 = (undefined8 *)((long)puVar26 + lVar52 + 0x8d);
            *puVar30 = 0;
            puVar30[1] = 0;
            *(undefined8 *)((long)puVar26 + lVar52) = 0;
            ((undefined8 *)((long)puVar26 + lVar52))[1] = 0;
            *(undefined8 *)((long)puVar26 + lVar52 + 0xd) = 0;
            puVar30 = (undefined8 *)((long)puVar26 + lVar52 + 0x2c);
            *puVar30 = 0;
            puVar30[1] = 0;
            puVar30 = (undefined8 *)((long)puVar26 + lVar52 + 0x3c);
            *puVar30 = 0;
            puVar30[1] = 0;
            puVar30 = (undefined8 *)((long)puVar26 + lVar52 + 0x4c);
            *puVar30 = 0;
            puVar30[1] = 0;
            puVar30 = (undefined8 *)((long)puVar26 + lVar52 + 0x55);
            *puVar30 = 0;
            puVar30[1] = 0;
            lVar52 = lVar52 + 0xa0;
            local_2b0 = local_2b0 + 1;
          } while (local_2b0 != 5);
          tcu::Surface::Surface
                    (&local_2d0,(this->m_viewportSize).m_data[0],(this->m_viewportSize).m_data[1]);
          tcu::Surface::Surface
                    (&local_2f0,(this->m_viewportSize).m_data[0],(this->m_viewportSize).m_data[1]);
          local_218.order = R;
          local_218.type = SNORM_INT8;
          lStack_210 = 0x3f80000000000000;
          local_208 = (pointer)0x3f800000;
          puStack_200 = &DAT_3f0000003f000000;
          local_1f8 = 0x3f80000000000000;
          puStack_1f0 = &DAT_3f0000003f000000;
          local_1e8 = &DAT_3f8000003f800000;
          uStack_1e0 = 0x3f800000;
          rsg::computeUniformValues
                    ((Random *)&local_1c0,
                     (vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> *)&local_318,
                     &this->m_unifiedUniforms);
          ppSVar27 = (this->m_vertexShader).m_inputs.
                     super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          local_298 = lVar52;
          if (0 < (int)((ulong)((long)(this->m_vertexShader).m_inputs.
                                      super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar27)
                       >> 3)) {
            lVar34 = 0;
            do {
              pVVar25 = vStack_330.
                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (lVar37 != lVar34) {
                pSVar8 = ppSVar27[lVar34];
                pVVar7 = pSVar8->m_variable;
                pfVar29 = *(float **)
                           &(pSVar8->m_min).
                            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                            super__Vector_impl_data;
                pfVar9 = *(float **)
                          &(pSVar8->m_max).
                           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                           super__Vector_impl_data;
                iVar16 = (pVVar7->m_type).m_numElements;
                VVar4 = vStack_330.
                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar34].pointer.componentType;
                VVar5 = vStack_330.
                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar34].pointer.convert;
                iVar31 = vStack_330.
                         super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar34].pointer.numComponents;
                local_350 = CONCAT44(local_350._4_4_,
                                     vStack_330.
                                     super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar34].pointer.
                                     numElements);
                iVar50 = vStack_330.
                         super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar34].pointer.stride;
                local_2a0 = (ulong *)vStack_330.
                                     super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar34].pointer.data;
                local_230 = local_348.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                local_1b0._0_4_ =
                     vStack_330.
                     super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar34].binding.type;
                local_1a8 = (TextureFormat)(local_1a0 + 8);
                pcVar10 = vStack_330.
                          super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar34].binding.name._M_dataplus
                          ._M_p;
                local_238 = local_348.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)(local_1b0 + 8),pcVar10,
                           pcVar10 + vStack_330.
                                     super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar34].binding.name.
                                     _M_string_length);
                iVar41 = 0;
                puVar28 = (pointer)0x0;
                if (local_230 != local_238) {
                  puVar28 = local_230;
                }
                local_188 = pVVar25[lVar34].binding.location;
                local_180[0].convert = VVar5;
                local_180[0].componentType = VVar4;
                local_180[0].numComponents = iVar31;
                local_180[0].numElements = (int)local_350;
                local_180[0].stride = iVar50;
                local_180[0].data = puVar28 + (long)local_2a0;
                do {
                  iVar31 = (int)lVar34 + iVar41;
                  uVar32 = iVar31 + this->m_iterNdx;
                  uVar14 = this->m_iterNdx + iVar31 + 3;
                  if (-1 < (int)uVar32) {
                    uVar14 = uVar32;
                  }
                  if (3 < iVar16 - 1U) goto LAB_018b0364;
                  lVar37 = (long)(int)(uVar32 - (uVar14 & 0xfffffffc));
                  pTVar22 = &local_218 + lVar37 * 2;
                  switch(iVar16) {
                  case 1:
                    fVar54 = (float)pTVar22->order;
                    rsg::VariableType::getElementType(&pVVar7->m_type);
                    fVar3 = *pfVar29;
                    rsg::VariableType::getElementType(&pVVar7->m_type);
                    *(float *)((long)local_180[0].data + (long)(local_180[0].stride * iVar41)) =
                         fVar54 * *pfVar9 + fVar3 * (1.0 - fVar54);
                    break;
                  case 2:
                    local_368.order = R;
                    local_368.type = SNORM_INT8;
                    local_368 = *pTVar22;
                    local_288._0_4_ = R;
                    local_288._4_4_ = SNORM_INT8;
                    lVar37 = 0;
                    do {
                      rsg::VariableType::getElementType(&pVVar7->m_type);
                      fVar54 = pfVar29[lVar37];
                      fVar3 = (float)(&local_368.order)[lVar37];
                      rsg::VariableType::getElementType(&pVVar7->m_type);
                      *(float *)(local_288 + lVar37 * 4) =
                           fVar3 * pfVar9[lVar37] + fVar54 * (1.0 - fVar3);
                      lVar37 = lVar37 + 1;
                    } while (lVar37 == 1);
                    lVar37 = (long)(local_180[0].stride * iVar41);
                    goto LAB_018b0358;
                  case 3:
                    pRStack_360 = (ReferenceContext *)
                                  CONCAT44(pRStack_360._4_4_,(int)(&lStack_210)[lVar37 * 2]);
                    local_368 = *pTVar22;
                    local_288._0_4_ = R;
                    local_288._4_4_ = SNORM_INT8;
                    TStack_280 = (TextureFormat)((ulong)TStack_280 & 0xffffffff00000000);
                    lVar37 = 0;
                    do {
                      rsg::VariableType::getElementType(&pVVar7->m_type);
                      fVar54 = pfVar29[lVar37];
                      fVar3 = (float)(&local_368.order)[lVar37];
                      rsg::VariableType::getElementType(&pVVar7->m_type);
                      *(float *)(local_288 + lVar37 * 4) =
                           fVar3 * pfVar9[lVar37] + fVar54 * (1.0 - fVar3);
                      lVar37 = lVar37 + 1;
                    } while (lVar37 != 3);
                    lVar37 = (long)(local_180[0].stride * iVar41);
                    *(ChannelOrder *)((long)local_180[0].data + lVar37 + 8) = TStack_280.order;
LAB_018b0358:
                    ((TextureFormat *)((long)local_180[0].data + lVar37))->order = local_288._0_4_;
                    ((TextureFormat *)((long)local_180[0].data + lVar37))->type = local_288._4_4_;
                    break;
                  case 4:
                    local_368 = *pTVar22;
                    pRStack_360 = (ReferenceContext *)(&lStack_210)[lVar37 * 2];
                    local_288._0_4_ = R;
                    local_288._4_4_ = SNORM_INT8;
                    TStack_280.order = R;
                    TStack_280.type = SNORM_INT8;
                    lVar37 = 0;
                    do {
                      rsg::VariableType::getElementType(&pVVar7->m_type);
                      fVar54 = pfVar29[lVar37];
                      fVar3 = (float)(&local_368.order)[lVar37];
                      rsg::VariableType::getElementType(&pVVar7->m_type);
                      *(float *)(local_288 + lVar37 * 4) =
                           fVar3 * pfVar9[lVar37] + fVar54 * (1.0 - fVar3);
                      lVar37 = lVar37 + 1;
                    } while (lVar37 != 4);
                    pTVar22 = (TextureFormat *)
                              ((long)local_180[0].data + (long)(local_180[0].stride * iVar41));
                    pTVar22->order = local_288._0_4_;
                    pTVar22->type = local_288._4_4_;
                    pTVar22[1] = TStack_280;
                  }
LAB_018b0364:
                  iVar41 = iVar41 + 1;
                } while (iVar41 != 4);
                lVar37 = local_2a8;
                lVar52 = local_298;
                if (local_1a8 != (TextureFormat)(local_1a0 + 8)) {
                  operator_delete((void *)local_1a8,local_1a0._8_8_ + 1);
                  lVar37 = local_2a8;
                  lVar52 = local_298;
                }
              }
              lVar34 = lVar34 + 1;
              ppSVar27 = (this->m_vertexShader).m_inputs.
                         super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            } while (lVar34 < (int)((ulong)((long)(this->m_vertexShader).m_inputs.
                                                  super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)ppSVar27) >> 3));
          }
          local_2a0 = (ulong *)((long)puVar26 + lVar52 + -0xa0);
          puVar42 = puVar26;
          if (lVar52 != 0) {
            do {
              iVar16 = (*this->m_renderCtx->_vptr_RenderContext[2])();
              local_350 = CONCAT44(local_350._4_4_,iVar16);
              iVar16 = (this->m_viewportSize).m_data[0];
              iVar31 = (this->m_viewportSize).m_data[1];
              fVar54 = ceilf((float)iVar16 * 0.5);
              iVar50 = (int)fVar54;
              fVar54 = ceilf((float)iVar31 * 0.5);
              if (iVar16 == 0x7fffffff && iVar50 == -0x80000000) {
                dVar17 = deRandom_getUint32(&local_1c0);
              }
              else {
                dVar17 = deRandom_getUint32(&local_1c0);
                dVar17 = dVar17 % ((iVar16 - iVar50) + 1U) + iVar50;
              }
              iVar50 = (int)fVar54;
              if (iVar31 == 0x7fffffff && iVar50 == -0x80000000) {
                dVar18 = deRandom_getUint32(&local_1c0);
              }
              else {
                dVar18 = deRandom_getUint32(&local_1c0);
                dVar18 = dVar18 % ((iVar31 - iVar50) + 1U) + iVar50;
              }
              dVar19 = deRandom_getUint32(&local_1c0);
              uVar46 = (ulong)dVar19 % (ulong)((iVar16 - dVar17) + 1);
              dVar19 = deRandom_getUint32(&local_1c0);
              uVar36 = (ulong)dVar19 % (ulong)((iVar31 - dVar18) + 1);
              uVar32 = (uint)uVar36;
              dVar15 = deRandom_getBool(&local_1c0);
              dVar20 = deRandom_getBool(&local_1c0);
              uVar14 = (dVar18 - 1) + uVar32;
              if (dVar20 == 1) {
                uVar36 = (ulong)uVar14;
                uVar14 = uVar32;
              }
              uVar32 = (dVar17 - 1) + (int)uVar46;
              uVar45 = uVar46;
              if (dVar15 == 1) {
                uVar45 = (ulong)uVar32;
              }
              uVar38 = (ulong)uVar32;
              if (dVar15 == 1) {
                uVar38 = uVar46;
              }
              *puVar42 = uVar45 | uVar36 << 0x20;
              puVar42[1] = uVar38 | (ulong)uVar14 << 0x20;
              local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffff00000000);
              de::Random::choose<float_const*,float*>
                        ((Random *)&local_1c0,
                         (float *)gls::(anonymous_namespace)::getRandomDepth(de::Random&)::
                                  depthValues,(float *)&DAT_01cf4d20,(float *)local_1b0,1);
              *(undefined4 *)(puVar42 + 2) = local_1b0._0_4_;
              InteractionTestUtil::computeRandomRenderState
                        ((Random *)&local_1c0,(RenderState *)((long)puVar42 + 0x14),
                         (ApiType)((uint)local_350 & 0x3ff),iVar16,iVar31);
              bVar53 = local_2a0 != puVar42;
              puVar42 = puVar42 + 0x14;
            } while (bVar53);
          }
          lVar37 = local_290;
          pVVar25 = vStack_330.
                    super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar2 = local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          puVar28 = local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (0 < (int)local_2b0) {
            pfVar29 = (float *)(puVar26 + 2);
            lVar52 = 0;
            do {
              *pfVar29 = (float)(int)lVar52 * 0.0231725 + *pfVar29;
              lVar52 = lVar52 + 1;
              pfVar29 = pfVar29 + 0x28;
            } while (lVar52 != 5);
          }
          VVar4 = *(VertexComponentType *)
                   ((long)vStack_330.
                          super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_290 * 8 + -0x18);
          VVar5 = *(VertexComponentConversion *)
                   ((long)vStack_330.
                          super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_290 * 8 + -0x14);
          iVar16 = *(int *)((long)vStack_330.
                                  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_290 * 8 + -0x10)
          ;
          iVar31 = *(int *)((long)vStack_330.
                                  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_290 * 8 + -0xc);
          iVar50 = *(int *)((long)vStack_330.
                                  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_290 * 8 + -8);
          lVar52 = *(long *)(&((vStack_330.
                                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                ._M_impl.super__Vector_impl_data._M_start)->binding).type +
                            local_290 * 2);
          local_1b0._0_4_ =
               *(Type *)((long)vStack_330.
                               super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                               ._M_impl.super__Vector_impl_data._M_start + local_290 * 8 + -0x48);
          local_1a8 = (TextureFormat)(local_1a0 + 8);
          lVar34 = *(long *)((long)vStack_330.
                                   super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_290 * 8 + -0x40
                            );
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_1b0 + 8),lVar34,
                     *(long *)((long)vStack_330.
                                     super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                              local_290 * 8 + -0x38) + lVar34);
          local_180[0].data = (pointer)0x0;
          if (puVar28 != puVar2) {
            local_180[0].data = puVar28;
          }
          local_180[0].data = (void *)((long)local_180[0].data + lVar52);
          local_188 = *(int *)((long)pVVar25 + lVar37 * 8 + -0x20);
          local_180[0].convert = VVar5;
          local_180[0].componentType = VVar4;
          local_180[0].numComponents = iVar16;
          local_38 = (pointer)local_180[0].data;
          local_180[0].numElements = iVar31;
          local_180[0].stride = iVar50;
          if (local_1a8 != (TextureFormat)(local_1a0 + 8)) {
            operator_delete((void *)local_1a8,local_1a0._8_8_ + 1);
          }
          lVar37 = local_298;
          local_368 = (TextureFormat)this->m_glCtx;
          pRStack_360 = &this->m_referenceCtx->context;
          local_1c8[0] = this->m_glProgram;
          local_1c8[1] = this->m_refProgram;
          local_1b0._0_4_ = RGBA;
          local_1b0._4_4_ = UNORM_INT8;
          pvVar44 = (void *)local_2d0.m_pixels.m_cap;
          if ((void *)local_2d0.m_pixels.m_cap != (void *)0x0) {
            pvVar44 = local_2d0.m_pixels.m_ptr;
          }
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_288,(TextureFormat *)local_1b0,local_2d0.m_width,
                     local_2d0.m_height,1,pvVar44);
          local_1b0._0_4_ = RGBA;
          local_1b0._4_4_ = UNORM_INT8;
          pvVar44 = (void *)local_2f0.m_pixels.m_cap;
          if ((void *)local_2f0.m_pixels.m_cap != (void *)0x0) {
            pvVar44 = local_2f0.m_pixels.m_ptr;
          }
          tcu::PixelBufferAccess::PixelBufferAccess
                    (&local_260,(TextureFormat *)local_1b0,local_2f0.m_width,local_2f0.m_height,1,
                     pvVar44);
          iVar16 = (*this->m_renderCtx->_vptr_RenderContext[4])();
          lVar52 = CONCAT44(extraout_var,iVar16);
          local_230 = (pointer)(long)iVar50;
          local_21c = gls::anon_unknown_0::getWellBehavingChannelColor(0.0,*(int *)(lVar52 + 8));
          local_220 = gls::anon_unknown_0::getWellBehavingChannelColor(0.25,*(int *)(lVar52 + 0xc));
          local_224 = gls::anon_unknown_0::getWellBehavingChannelColor(0.5,*(int *)(lVar52 + 0x10));
          local_228 = gls::anon_unknown_0::getWellBehavingChannelColor(1.0,*(int *)(lVar52 + 0x14));
          local_238 = (pointer)(long)(iVar50 * 2);
          local_2a8 = (long)(iVar50 * 3);
          lVar52 = 0;
          do {
            TVar35 = (&local_368)[lVar52];
            local_2b0 = lVar52;
            dVar17 = local_1c8[lVar52];
            if (0 < (int)((ulong)((long)vStack_330.
                                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)vStack_330.
                                       super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                    -0x33333333) {
              lVar34 = 0x48;
              lVar52 = 0;
              do {
                pVVar25 = vStack_330.
                          super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar2 = local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                puVar28 = local_348.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                local_1a8 = (TextureFormat)(local_1a0 + 8);
                VVar4 = *(VertexComponentType *)
                         ((long)vStack_330.
                                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar34 + -0x18);
                VVar5 = *(VertexComponentConversion *)
                         ((long)vStack_330.
                                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar34 + -0x14);
                iVar16 = *(int *)((long)vStack_330.
                                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar34 + -0x10);
                local_290 = CONCAT44(local_290._4_4_,
                                     *(undefined4 *)
                                      ((long)vStack_330.
                                             super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                      lVar34 + -0xc));
                iVar31 = *(int *)((long)vStack_330.
                                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar34 + -8);
                lVar11 = *(long *)((long)&((vStack_330.
                                            super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->binding).
                                          type + lVar34);
                local_1b0._0_4_ =
                     *(Type *)((long)vStack_330.
                                     super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar34 + -0x48);
                lVar37 = *(long *)((long)vStack_330.
                                         super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar34 + -0x40)
                ;
                local_350 = lVar52;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)(local_1b0 + 8),lVar37,
                           *(long *)((long)vStack_330.
                                           super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                    lVar34 + -0x38) + lVar37);
                lVar37 = local_298;
                local_180[0].data = (pointer)0x0;
                if (puVar28 != puVar2) {
                  local_180[0].data = puVar28;
                }
                local_180[0].data = (void *)((long)local_180[0].data + lVar11);
                iVar50 = *(int *)((long)pVVar25 + lVar34 + -0x20);
                local_180[0].convert = VVar5;
                local_180[0].componentType = VVar4;
                local_180[0].numElements = (int)local_290;
                local_188 = iVar50;
                local_180[0].numComponents = iVar16;
                local_180[0].stride = iVar31;
                if ((float)local_1b0._0_4_ == 1.4013e-45) {
                  iVar50 = (**(code **)(*(long *)TVar35 + 0x2c8))(TVar35,dVar17,local_1a8);
                }
                if (-1 < iVar50) {
                  (**(code **)(*(long *)TVar35 + 0x280))(TVar35,iVar50);
                  (**(code **)(*(long *)TVar35 + 0x270))
                            (TVar35,iVar50,local_180[0].numComponents,0x1406,0,local_180[0].stride,
                             local_180[0].data);
                }
                lVar52 = local_350;
                if (local_1a8 != (TextureFormat)(local_1a0 + 8)) {
                  operator_delete((void *)local_1a8,local_1a0._8_8_ + 1);
                }
                lVar52 = lVar52 + 1;
                lVar34 = lVar34 + 0x50;
              } while (lVar52 < (int)((ulong)((long)vStack_330.
                                                                                                        
                                                  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)vStack_330.
                                                                                                      
                                                  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                -0x33333333);
            }
            (**(code **)(*(long *)TVar35 + 0x1a0))(TVar35,0xc11);
            (**(code **)(*(long *)TVar35 + 0x220))(TVar35,1,1,1,1);
            (**(code **)(*(long *)TVar35 + 0x228))(TVar35,1);
            (**(code **)(*(long *)TVar35 + 0x230))(TVar35,0xffffffff);
            (**(code **)(*(long *)TVar35 + 0x150))(local_21c,local_220,local_224,local_228,TVar35);
            (**(code **)(*(long *)TVar35 + 0x168))(TVar35,0x4500);
            (**(code **)(*(long *)TVar35 + 0x3b0))(TVar35,dVar17);
            _Var40._M_p = local_318._M_dataplus._M_p;
            if (local_318._M_dataplus._M_p != (pointer)local_318._M_string_length) {
              do {
                uVar21 = (**(code **)(*(long *)TVar35 + 0x330))
                                   (TVar35,dVar17,*(undefined8 *)(*(long *)_Var40._M_p + 0x58));
                puVar12 = *(uint **)_Var40._M_p;
                uVar14 = *puVar12;
                if (7 < uVar14) {
LAB_018b1263:
                  this_00 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::InternalError::InternalError
                            ((InternalError *)this_00,"Unsupported type",
                             glcts::fixed_sample_locations_values + 1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragOpInteractionCase.cpp"
                             ,0x169);
                  ppuVar47 = &tcu::InternalError::typeinfo;
LAB_018b1254:
                  __cxa_throw(this_00,ppuVar47,tcu::Exception::~Exception);
                }
                if ((0xccU >> (uVar14 & 0x1f) & 1) == 0) {
                  if (uVar14 != 1) goto LAB_018b1263;
                  uVar46 = (ulong)(puVar12[10] - 1);
                  lVar52 = 0x2e0;
                  if (3 < puVar12[10] - 1) {
                    this_00 = (TestError *)
                              __cxa_allocate_exception
                                        (0x38,0x2e0,uVar46,*(long *)((long)_Var40._M_p + 8));
                    tcu::TestError::TestError
                              (this_00,"Unsupported type",(char *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragOpInteractionCase.cpp"
                               ,0x156);
                    goto LAB_018b124d;
                  }
                }
                else {
                  uVar46 = (ulong)(puVar12[10] - 1);
                  lVar52 = 0x300;
                  if (3 < puVar12[10] - 1) {
                    this_00 = (TestError *)
                              __cxa_allocate_exception
                                        (0x38,0x300,uVar46,*(long *)((long)_Var40._M_p + 8));
                    tcu::TestError::TestError
                              (this_00,"Unsupported type",(char *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragOpInteractionCase.cpp"
                               ,0x164);
LAB_018b124d:
                    ppuVar47 = &tcu::TestError::typeinfo;
                    goto LAB_018b1254;
                  }
                }
                (**(code **)(*(long *)TVar35 + lVar52 + uVar46 * 8))(TVar35,uVar21,1);
                _Var40._M_p = _Var40._M_p + 0x20;
              } while (_Var40._M_p != (pointer)local_318._M_string_length);
            }
            puVar28 = local_38;
            puVar42 = puVar26;
            if (lVar37 != 0) {
              do {
                if (*(char *)((long)puVar42 + 0x14) == '\x01') {
                  (**(code **)(*(long *)TVar35 + 0x198))(TVar35,0xc11);
                  (**(code **)(*(long *)TVar35 + 400))
                            (TVar35,(int)puVar42[3],*(int *)((long)puVar42 + 0x1c),(int)puVar42[4],
                             *(int *)((long)puVar42 + 0x24));
                }
                else {
                  (**(code **)(*(long *)TVar35 + 0x1a0))(TVar35,0xc11);
                }
                if ((char)puVar42[5] == '\x01') {
                  (**(code **)(*(long *)TVar35 + 0x198))(TVar35,0xb90);
                  lVar37 = 0x44;
                  do {
                    uVar14 = lVar37 == 0x60 | 0x404;
                    (**(code **)(*(long *)TVar35 + 0x1b8))
                              (TVar35,uVar14,*(undefined4 *)((long)puVar42 + lVar37 + -0x18),
                               *(undefined4 *)((long)puVar42 + lVar37 + -0x14),
                               *(undefined4 *)((long)puVar42 + lVar37 + -0x10));
                    (**(code **)(*(long *)TVar35 + 0x1c0))
                              (TVar35,uVar14,*(undefined4 *)((long)puVar42 + lVar37 + -0xc),
                               *(undefined4 *)((long)puVar42 + lVar37 + -8),
                               *(undefined4 *)((long)puVar42 + lVar37 + -4));
                    (**(code **)(*(long *)TVar35 + 0x238))
                              (TVar35,uVar14,*(undefined4 *)((long)puVar42 + lVar37));
                    lVar37 = lVar37 + 0x1c;
                  } while (lVar37 == 0x60);
                }
                else {
                  (**(code **)(*(long *)TVar35 + 0x1a0))(TVar35,0xb90);
                }
                if (*(char *)((long)puVar42 + 100) == '\x01') {
                  (**(code **)(*(long *)TVar35 + 0x198))(TVar35,0xb71);
                  (**(code **)(*(long *)TVar35 + 0x1c8))(TVar35,(int)puVar42[0xd]);
                  uVar46 = (ulong)*(byte *)((long)puVar42 + 0x6c);
                  puVar30 = (undefined8 *)(*(long *)TVar35 + 0x228);
                }
                else {
                  puVar30 = (undefined8 *)(*(long *)TVar35 + 0x1a0);
                  uVar46 = 0xb71;
                }
                (*(code *)*puVar30)(TVar35,uVar46);
                if (*(char *)((long)puVar42 + 0x6d) == '\x01') {
                  (**(code **)(*(long *)TVar35 + 0x198))(TVar35,0xbe2);
                  (**(code **)(*(long *)TVar35 + 0x200))
                            (TVar35,(int)puVar42[0xe],*(int *)((long)puVar42 + 0x7c));
                  (**(code **)(*(long *)TVar35 + 0x210))
                            (TVar35,*(int *)((long)puVar42 + 0x74),(int)puVar42[0xf],
                             (int)puVar42[0x10],*(int *)((long)puVar42 + 0x84));
                  (**(code **)(*(long *)TVar35 + 0x218))
                            ((int)puVar42[0x11],*(int *)((long)puVar42 + 0x8c),(int)puVar42[0x12],
                             *(int *)((long)puVar42 + 0x94),TVar35);
                }
                else {
                  (**(code **)(*(long *)TVar35 + 0x1a0))(TVar35,0xbe2);
                }
                (**(code **)(*(long *)TVar35 + 0x198 + (ulong)((byte)puVar42[0x13] ^ 1) * 8))
                          (TVar35,0xbd0);
                (**(code **)(*(long *)TVar35 + 0x220))
                          (TVar35,*(undefined1 *)((long)puVar42 + 0x99),
                           *(undefined1 *)((long)puVar42 + 0x9a),
                           *(undefined1 *)((long)puVar42 + 0x9b),
                           *(undefined1 *)((long)puVar42 + 0x9c));
                iVar16 = (int)puVar42[2];
                local_1b0._0_4_ = 0x10000;
                local_1b0._4_4_ = 0x20002;
                local_1a8.order = 0x30001;
                iVar31 = (int)puVar42[1];
                iVar50 = (int)*puVar42;
                uVar56 = 0x3f800000;
                uVar55 = 0x3f800000;
                uVar21 = 0xbf800000;
                iVar41 = iVar50 - iVar31;
                if (iVar41 == 0 || iVar50 < iVar31) {
                  uVar55 = 0xbf800000;
                  uVar21 = 0x3f800000;
                }
                iVar33 = *(int *)((long)puVar42 + 4);
                if (iVar50 < iVar31) {
                  iVar31 = iVar50;
                }
                iVar50 = *(int *)((long)puVar42 + 0xc);
                iVar48 = iVar33 - iVar50;
                if (iVar48 == 0 || iVar33 < iVar50) {
                  uVar56 = 0xbf800000;
                }
                *(undefined4 *)puVar28 = uVar55;
                *(undefined4 *)(puVar28 + 4) = uVar56;
                *(int *)(puVar28 + 8) = iVar16;
                puVar28[0xc] = '\0';
                puVar28[0xd] = '\0';
                puVar28[0xe] = 0x80;
                puVar28[0xf] = '?';
                *(undefined4 *)(puVar28 + (long)local_230) = uVar21;
                *(undefined4 *)(puVar28 + (long)local_230 + 4) = uVar56;
                *(int *)(puVar28 + (long)local_230 + 8) = iVar16;
                puVar2 = puVar28 + (long)local_230 + 0xc;
                puVar2[0] = '\0';
                puVar2[1] = '\0';
                puVar2[2] = 0x80;
                puVar2[3] = '?';
                uVar56 = 0xbf800000;
                if (iVar48 == 0 || iVar33 < iVar50) {
                  uVar56 = 0x3f800000;
                }
                *(undefined4 *)(puVar28 + (long)local_238) = uVar55;
                *(undefined4 *)(puVar28 + (long)local_238 + 4) = uVar56;
                *(int *)(puVar28 + (long)local_238 + 8) = iVar16;
                puVar2 = puVar28 + (long)local_238 + 0xc;
                puVar2[0] = '\0';
                puVar2[1] = '\0';
                puVar2[2] = 0x80;
                puVar2[3] = '?';
                *(undefined4 *)(puVar28 + local_2a8) = uVar21;
                *(undefined4 *)(puVar28 + local_2a8 + 4) = uVar56;
                *(int *)(puVar28 + local_2a8 + 8) = iVar16;
                if (iVar33 < iVar50) {
                  iVar50 = iVar33;
                }
                iVar16 = -iVar48;
                if (0 < iVar48) {
                  iVar16 = iVar48;
                }
                puVar2 = puVar28 + local_2a8 + 0xc;
                puVar2[0] = '\0';
                puVar2[1] = '\0';
                puVar2[2] = 0x80;
                puVar2[3] = '?';
                iVar33 = -iVar41;
                if (0 < iVar41) {
                  iVar33 = iVar41;
                }
                (**(code **)(*(long *)TVar35 + 0x28))(TVar35,iVar31,iVar50,iVar33 + 1,iVar16 + 1);
                (**(code **)(*(long *)TVar35 + 0x350))(TVar35,4,6,0x1403,local_1b0);
                bVar53 = local_2a0 != puVar42;
                puVar42 = puVar42 + 0x14;
              } while (bVar53);
            }
            dVar17 = (**(code **)(*(long *)TVar35 + 0x3c8))(TVar35);
            lVar37 = local_298;
            glu::checkError(dVar17,"Rendering failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragOpInteractionCase.cpp"
                            ,0x25c);
            (**(code **)(*(long *)TVar35 + 0x3c0))
                      (TVar35,0,0,(this->m_viewportSize).m_data[0],(this->m_viewportSize).m_data[1],
                       0x1908,0x1401,(&uStack_268)[local_2b0 * 5]);
            lVar52 = local_2b0 + 1;
          } while (local_2b0 == 0);
          iVar16 = (*this->m_renderCtx->_vptr_RenderContext[4])();
          lVar37 = CONCAT44(extraout_var_00,iVar16);
          bVar43 = 8 - *(char *)(lVar37 + 8);
          uVar14 = 0;
          if (0 < *(int *)(lVar37 + 0x14)) {
            uVar14 = 0x1000000 << (8U - (char)*(int *)(lVar37 + 0x14) & 0x1f);
          }
          uVar51 = 0x100 << (8U - *(char *)(lVar37 + 0xc) & 0x1f) | 1 << (bVar43 & 0x1f);
          uVar14 = 0x10000 << (8U - *(char *)(lVar37 + 0x10) & 0x1f) | uVar51 | uVar14;
          uVar32 = 1 << (bVar43 & 0x1f) & 0xff;
          if (0xfb < uVar32) {
            uVar32 = 0xfc;
          }
          uVar51 = uVar51 >> 8 & 0xff;
          if (0xfb < uVar51) {
            uVar51 = 0xfc;
          }
          uVar49 = uVar14 >> 0x10 & 0xff;
          if (0xfb < uVar49) {
            uVar49 = 0xfc;
          }
          uVar14 = uVar14 >> 0x18;
          if (0xfb < uVar14) {
            uVar14 = 0xfc;
          }
          pTVar6 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
          local_288._0_4_ = RGBA;
          local_288._4_4_ = UNORM_INT8;
          if ((void *)local_2f0.m_pixels.m_cap != (void *)0x0) {
            local_2f0.m_pixels.m_cap = (size_t)local_2f0.m_pixels.m_ptr;
          }
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_1b0,(TextureFormat *)local_288,local_2f0.m_width,
                     local_2f0.m_height,1,(void *)local_2f0.m_pixels.m_cap);
          local_368.order = RGBA;
          local_368.type = UNORM_INT8;
          if ((void *)local_2d0.m_pixels.m_cap != (void *)0x0) {
            local_2d0.m_pixels.m_cap = (size_t)local_2d0.m_pixels.m_ptr;
          }
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_288,&local_368,local_2d0.m_width,local_2d0.m_height,
                     1,(void *)local_2d0.m_pixels.m_cap);
          bVar53 = tcu::bilinearCompare
                             (pTVar6,"CompareResult","Image comparison result",
                              (ConstPixelBufferAccess *)local_1b0,
                              (ConstPixelBufferAccess *)local_288,
                              (RGBA)(uVar14 * 0x1000000 + (uVar49 << 0x10 | uVar51 << 8 | uVar32) +
                                    0x3030303),COMPARE_LOG_RESULT);
          if (!bVar53) {
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                       "Image comparison failed");
            IVar39 = STOP;
            if (!bVar53) goto LAB_018b117d;
          }
          iVar16 = this->m_iterNdx + 1;
          this->m_iterNdx = iVar16;
          IVar39 = (IterateResult)(iVar16 < 5);
LAB_018b117d:
          tcu::Surface::~Surface(&local_2f0);
          tcu::Surface::~Surface(&local_2d0);
          operator_delete(puVar26,800);
          std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::~vector
                    ((vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> *)&local_318);
          std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
                    (&vStack_330);
          if (local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_348.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_348.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_348.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          tcu::TestLog::endSection(local_1d0.m_log);
          return IVar39;
        }
        break;
      }
      lVar52 = lVar52 + 1;
      ppSVar27 = (this->m_vertexShader).m_inputs.
                 super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      lVar34 = (long)(int)((ulong)((long)(this->m_vertexShader).m_inputs.
                                         super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar27
                                  ) >> 3);
      lVar37 = local_290 + 10;
      bVar53 = lVar52 < lVar34;
    } while (lVar52 < lVar34);
  }
  pIVar24 = (InternalError *)__cxa_allocate_exception(0x38);
  local_278._M_allocated_capacity._0_4_ = 0x50514564;
  local_278._M_allocated_capacity._4_4_ = 0x736f505f;
  local_278._8_4_ = 0x6f697469;
  local_278._M_local_buf[0xc] = 'n';
  TStack_280.order = sRG;
  TStack_280.type = SNORM_INT8;
  local_278._M_local_buf[0xd] = '\0';
  local_288 = (undefined1  [8])&local_278;
  pTVar22 = (TextureFormat *)std::__cxx11::string::append(local_288);
  local_1b0 = *(undefined1 (*) [8])pTVar22;
  TVar35 = (TextureFormat)(pTVar22 + 2);
  if ((TextureFormat)local_1b0 == TVar35) {
    local_1a0._0_8_ = *(undefined8 *)TVar35;
    local_1a0._8_8_ = pTVar22[3];
    local_1b0 = (undefined1  [8])((long)local_1b0 + 0x10);
  }
  else {
    local_1a0._0_8_ = *(undefined8 *)TVar35;
  }
  local_1a8 = pTVar22[1];
  *pTVar22 = TVar35;
  pTVar22[1].order = R;
  pTVar22[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar22[2].order = R;
  tcu::InternalError::InternalError(pIVar24,(string *)local_1b0);
  __cxa_throw(pIVar24,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

FragOpInteractionCase::IterateResult FragOpInteractionCase::iterate (void)
{
	de::Random							rnd					(m_params.seed ^ deInt32Hash(m_iterNdx));
	const tcu::ScopedLogSection			section				(m_testCtx.getLog(), string("Iter") + de::toString(m_iterNdx), string("Iteration ") + de::toString(m_iterNdx));

	const int							positionNdx			= findShaderInputIndex(m_vertexShader.getInputs(), "dEQP_Position");

	const int							numVertices			= 4;
	VertexDataStorage					vertexData			(m_vertexShader.getInputs(), numVertices);
	std::vector<rsg::VariableValue>		uniformValues;
	std::vector<RenderCommand>			renderCmds			(NUM_COMMANDS_PER_ITERATION);

	tcu::Surface						rendered			(m_viewportSize.x(), m_viewportSize.y());
	tcu::Surface						reference			(m_viewportSize.x(), m_viewportSize.y());

	const tcu::Vec4						vtxInterpFactors[]	=
	{
		tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 0.0f, 0.5f, 0.5f),
		tcu::Vec4(0.0f, 1.0f, 0.5f, 0.5f),
		tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f)
	};

	rsg::computeUniformValues(rnd, uniformValues, m_unifiedUniforms);

	for (int attribNdx = 0; attribNdx < (int)m_vertexShader.getInputs().size(); ++attribNdx)
	{
		if (attribNdx == positionNdx)
			continue;

		const rsg::ShaderInput*				shaderIn		= m_vertexShader.getInputs()[attribNdx];
		const rsg::VariableType&			varType			= shaderIn->getVariable()->getType();
		const rsg::ConstValueRangeAccess	valueRange		= shaderIn->getValueRange();
		const int							numComponents	= varType.getNumElements();
		const glu::VertexArrayBinding		layoutEntry		= getEntryWithPointer(vertexData, attribNdx);

		DE_ASSERT(varType.getBaseType() == rsg::VariableType::TYPE_FLOAT);

		for (int vtxNdx = 0; vtxNdx < 4; vtxNdx++)
		{
			const int			fNdx	= (attribNdx+vtxNdx+m_iterNdx)%DE_LENGTH_OF_ARRAY(vtxInterpFactors);
			const tcu::Vec4&	f		= vtxInterpFactors[fNdx];

			switch (numComponents)
			{
				case 1:	setVertex(layoutEntry.pointer, vtxNdx, interpolateRange(valueRange, f.toWidth<1>()));	break;
				case 2:	setVertex(layoutEntry.pointer, vtxNdx, interpolateRange(valueRange, f.toWidth<2>()));	break;
				case 3:	setVertex(layoutEntry.pointer, vtxNdx, interpolateRange(valueRange, f.toWidth<3>()));	break;
				case 4:	setVertex(layoutEntry.pointer, vtxNdx, interpolateRange(valueRange, f.toWidth<4>()));	break;
				default:
					DE_ASSERT(false);
			}
		}
	}

	for (vector<RenderCommand>::iterator cmdIter = renderCmds.begin(); cmdIter != renderCmds.end(); ++cmdIter)
		computeRandomRenderCommand(rnd, *cmdIter, m_renderCtx.getType().getAPI(), m_viewportSize.x(), m_viewportSize.y());

	// Workaround for inaccurate barycentric/depth computation in current reference renderer:
	// Small bias is added to the draw call depths, in increasing order, to avoid accuracy issues in depth comparison.
	for (int cmdNdx = 0; cmdNdx < (int)renderCmds.size(); cmdNdx++)
		renderCmds[cmdNdx].depth += 0.0231725f * float(cmdNdx);

	{
		const glu::VertexArrayPointer		posPtr				= getEntryWithPointer(vertexData, positionNdx).pointer;

		sglr::Context* const				contexts[]			= { m_glCtx, &m_referenceCtx->context };
		const deUint32						programs[]			= { m_glProgram, m_refProgram };
		tcu::PixelBufferAccess				readDst[]			= { rendered.getAccess(), reference.getAccess() };

		const tcu::Vec4						accurateClearColor	= tcu::Vec4(0.0f, 0.25f, 0.5f, 1.0f);
		const tcu::Vec4						clearColor			= getWellBehavingColor(accurateClearColor, m_renderCtx.getRenderTarget().getPixelFormat());

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(contexts); ndx++)
		{
			sglr::Context&	ctx			= *contexts[ndx];
			const deUint32	program		= programs[ndx];

			setupAttributes(ctx, vertexData, program);

			ctx.disable		(GL_SCISSOR_TEST);
			ctx.colorMask	(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
			ctx.depthMask	(GL_TRUE);
			ctx.stencilMask	(~0u);
			ctx.clearColor	(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
			ctx.clear		(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

			ctx.useProgram	(program);

			for (vector<rsg::VariableValue>::const_iterator uniformIter = uniformValues.begin(); uniformIter != uniformValues.end(); ++uniformIter)
				setUniformValue(ctx, ctx.getUniformLocation(program, uniformIter->getVariable()->getName()), uniformIter->getValue());

			for (vector<RenderCommand>::const_iterator cmdIter = renderCmds.begin(); cmdIter != renderCmds.end(); ++cmdIter)
				render(ctx, posPtr, *cmdIter);

			GLU_EXPECT_NO_ERROR(ctx.getError(), "Rendering failed");

			ctx.readPixels(0, 0, m_viewportSize.x(), m_viewportSize.y(), GL_RGBA, GL_UNSIGNED_BYTE, readDst[ndx].getDataPtr());
		}
	}

	{
		const tcu::RGBA		threshold		= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold()+tcu::RGBA(3,3,3,3);
		const bool			compareOk		= tcu::bilinearCompare(m_testCtx.getLog(), "CompareResult", "Image comparison result", reference.getAccess(), rendered.getAccess(), threshold, tcu::COMPARE_LOG_RESULT);

		if (!compareOk)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
			return STOP;
		}
	}

	m_iterNdx += 1;
	return (m_iterNdx < NUM_ITERATIONS) ? CONTINUE : STOP;
}